

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

void Gia_ManProfileStructuresInt(Gia_Man_t *p,int nLimit,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Vec_Int_t *vArray;
  int *piVar5;
  Vec_Int_t *vCode;
  Vec_Int_t *p_00;
  Vec_Int_t *__ptr;
  void *__s;
  int *__ptr_00;
  int iVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                  ,0x314,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
  }
  Gia_ManStaticFanoutStart(p);
  vArray = (Vec_Int_t *)malloc(0x10);
  vArray->nCap = 100;
  vArray->nSize = 0;
  piVar5 = (int *)malloc(400);
  vArray->pArray = piVar5;
  iVar4 = p->nObjs;
  iVar6 = iVar4 * 5;
  vCode = (Vec_Int_t *)malloc(0x10);
  if (iVar4 * 5 - 1U < 0xf) {
    iVar6 = 0x10;
  }
  vCode->nSize = 0;
  vCode->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar6 << 2);
  }
  vCode->pArray = piVar5;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar6 = iVar4;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar6 << 2);
  }
  p_00->pArray = piVar5;
  iVar4 = p->nObjs;
  if ((0 < iVar4) && (pGVar7 = p->pObjs, pGVar7 != (Gia_Obj_t *)0x0)) {
    lVar9 = 0;
    do {
      Vec_IntPush(p_00,vCode->nSize);
      uVar13 = *(ulong *)pGVar7;
      iVar4 = (int)uVar13;
      if (((uVar13 & 0x1fffffff) == 0x1fffffff || -1 < iVar4) ||
         ((int)((uint)(uVar13 >> 0x20) & 0x1fffffff) < p->vCos->nSize - p->nRegs)) {
        pGVar3 = p->pObjs;
        if ((pGVar7 < pGVar3) || (pGVar3 + p->nObjs <= pGVar7)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if ((p->pMuxes == (uint *)0x0) ||
           (uVar8 = 3,
           p->pMuxes[(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555] == 0)) {
          iVar6 = (int)(uVar13 & 0x1fffffff);
          uVar8 = 2;
          if (iVar4 < 0 || iVar6 == 0x1fffffff) {
            uVar8 = (ulong)(iVar4 < 0 && iVar6 != 0x1fffffff);
          }
        }
        iVar4 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555;
        if ((-1 < iVar4) && (iVar4 < p->vFanoutNums->nSize)) {
          iVar4 = Gia_ManEncodeObj(p,(int)lVar9);
          Vec_IntPush(vCode,iVar4);
          (*(code *)(&DAT_00987a10 + *(int *)(&DAT_00987a10 + uVar8 * 4)))();
          return;
        }
        goto LAB_0072b2fc;
      }
      lVar9 = lVar9 + 1;
      iVar4 = p->nObjs;
    } while ((lVar9 < iVar4) && (pGVar7 = p->pObjs + lVar9, p->pObjs != (Gia_Obj_t *)0x0));
  }
  if (p_00->nSize != iVar4) {
    __assert_fail("Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                  ,0x348,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
  }
  Vec_IntPush(p_00,vCode->nSize);
  if (fVerbose != 0) {
    pcVar12 = "Showing TFI/node/TFO structures for all nodes:";
    puts("Showing TFI/node/TFO structures for all nodes:");
    if (0 < p->nObjs) {
      iVar4 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Gia_ManProfileCollect((Gia_Man_t *)pcVar12,iVar4,vCode,p_00,vArray);
        pcVar12 = (char *)p;
        Gia_ManProfilePrintOne(p,iVar4,vArray);
        iVar4 = iVar4 + 1;
      } while (iVar4 < p->nObjs);
    }
  }
  __ptr = Gia_ManProfileHash(p,vCode,p_00);
  uVar1 = __ptr->nSize;
  uVar13 = (ulong)uVar1;
  if (uVar13 == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = *__ptr->pArray;
    if (1 < (int)uVar1) {
      uVar8 = 1;
      do {
        uVar2 = __ptr->pArray[uVar8];
        if ((int)uVar14 <= (int)uVar2) {
          uVar14 = uVar2;
        }
        uVar8 = uVar8 + 1;
      } while (uVar13 != uVar8);
    }
  }
  iVar4 = uVar14 + 1;
  iVar6 = 0x10;
  if (0xe < uVar14) {
    iVar6 = iVar4;
  }
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar6 * 4);
  }
  memset(piVar5,0,(long)iVar4 << 2);
  if (iVar6 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar6 << 2);
  }
  memset(__s,0,(long)iVar4 << 2);
  uVar2 = p->nObjs;
  if ((0 < (int)uVar2) && (pGVar7 = p->pObjs, pGVar7 != (Gia_Obj_t *)0x0)) {
    uVar8 = 0;
    if ((int)uVar1 < 1) {
      uVar13 = uVar8;
    }
    do {
      if (uVar13 == uVar8) goto LAB_0072b2fc;
      uVar1 = __ptr->pArray[uVar8];
      uVar10 = (ulong)uVar1;
      uVar11 = (uint)*(undefined8 *)pGVar7;
      if (((~uVar11 & 0x1fffffff) == 0 || -1 < (int)uVar11) ||
         ((int)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x20) & 0x1fffffff) <
          p->vCos->nSize - p->nRegs)) {
        if (((int)uVar1 < 0) || ((int)uVar14 < (int)uVar1)) goto LAB_0072b2fc;
        iVar6 = piVar5[uVar10];
        if (iVar6 == 0) {
          *(int *)((long)__s + uVar10 * 4) = (int)uVar8;
        }
        piVar5[uVar10] = iVar6 + -1;
      }
      uVar8 = uVar8 + 1;
      pGVar7 = pGVar7 + 1;
    } while (uVar2 != uVar8);
  }
  __ptr_00 = Abc_MergeSortCost(piVar5,iVar4);
  printf("Showing TFI/node/TFO structures that appear more than %d times.\n",(ulong)(uint)nLimit);
  if (0 < (int)uVar14) {
    uVar13 = 0;
    do {
      if (uVar14 < (uint)__ptr_00[uVar13]) {
LAB_0072b2fc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (-piVar5[(uint)__ptr_00[uVar13]] < nLimit) break;
      printf("%6d : ",uVar13 & 0xffffffff);
      printf("%6d : ",(ulong)(uint)__ptr_00[uVar13]);
      if (uVar14 < (uint)__ptr_00[uVar13]) goto LAB_0072b2fc;
      printf("Weight =%6d  ",(ulong)(uint)-piVar5[(uint)__ptr_00[uVar13]]);
      pcVar12 = "First obj =";
      printf("First obj =");
      if (uVar14 < (uint)__ptr_00[uVar13]) goto LAB_0072b2fc;
      Gia_ManProfileCollect
                ((Gia_Man_t *)pcVar12,*(int *)((long)__s + (ulong)(uint)__ptr_00[uVar13] * 4),vCode,
                 p_00,vArray);
      if (uVar14 < (uint)__ptr_00[uVar13]) goto LAB_0072b2fc;
      Gia_ManProfilePrintOne(p,*(int *)((long)__s + (ulong)(uint)__ptr_00[uVar13] * 4),vArray);
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
  }
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (vArray->pArray != (int *)0x0) {
    free(vArray->pArray);
    vArray->pArray = (int *)0x0;
  }
  free(vArray);
  if (vCode->pArray != (int *)0x0) {
    free(vCode->pArray);
    vCode->pArray = (int *)0x0;
  }
  free(vCode);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  Gia_ManStaticFanoutStop(p);
  return;
}

Assistant:

void Gia_ManProfileStructuresInt( Gia_Man_t * p, int nLimit, int fVerbose )
{
    Vec_Int_t * vRes, * vCount, * vFirst;
    Vec_Int_t * vCode, * vCodeOffsets, * vArray;
    Gia_Obj_t * pObj, * pFanout;
    int i, k, nFanins, nFanouts, * pPerm, nClasses;
    assert( p->pMuxes );
    Gia_ManStaticFanoutStart( p );
    // create fanout codes
    vArray = Vec_IntAlloc( 100 );
    vCode = Vec_IntAlloc( 5 * Gia_ManObjNum(p) );
    vCodeOffsets = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        nFanins = Gia_ObjFaninNum(p, pObj);
        nFanouts = Gia_ObjFanoutNum(p, pObj);
        Vec_IntPush( vCode, Gia_ManEncodeObj(p, i) );
        if ( nFanins == 3 )
        {
            int iLit = Gia_ObjFaninLit2p(p, pObj);
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Abc_LitRegular(iLit)) );
            if ( Abc_LitIsCompl(iLit) )
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
            }
            else
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
            }
        }
        else if ( nFanins == 2 )
        {
            int Code0 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj));
            int Code1 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj));
            Vec_IntPush( vCode, Code0 < Code1 ? Code0 : Code1 );
            Vec_IntPush( vCode, Code0 < Code1 ? Code1 : Code0 );
        }
        else if ( nFanins == 1 )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
        else if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, Gia_ObjRoToRi(p, pObj))) );

        // add fanouts
        Vec_IntClear( vArray );
        Gia_ObjForEachFanoutStatic( p, pObj, pFanout, k )
        {
            int Index = Gia_ObjWhatFanin( p, pFanout, pObj );
            Gia_ObjType_t Type = Gia_ManEncodeFanout( p, pFanout, Index );
            Vec_IntPush( vArray, Type );
        }
        Vec_IntSort( vArray, 0 );
        Vec_IntAppend( vCode, vArray );
    }
    assert( Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p) );
    Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
    // print the results
    if ( fVerbose )
    {
        printf( "Showing TFI/node/TFO structures for all nodes:\n" );
        Gia_ManForEachObj( p, pObj, i )
        {
            Gia_ManProfileCollect( p, i, vCode, vCodeOffsets, vArray );
            Gia_ManProfilePrintOne( p, i, vArray );
        }
    }

    // collect statistics
    vRes = Gia_ManProfileHash( p, vCode, vCodeOffsets );
    //Vec_IntPrint( vRes );

    // count how many times each class appears
    nClasses = Vec_IntFindMax(vRes) + 1;
    vCount = Vec_IntStart( nClasses );
    vFirst = Vec_IntStart( nClasses );
    Gia_ManForEachObj( p, pObj, i )
    {
        int Entry = Vec_IntEntry( vRes, i );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        if ( Vec_IntEntry(vCount, Entry) == 0 )
            Vec_IntWriteEntry( vFirst, Entry, i );
        Vec_IntAddToEntry( vCount, Entry, -1 );
    }
    // sort the counts
    pPerm = Abc_MergeSortCost( Vec_IntArray(vCount), Vec_IntSize(vCount) );
    printf( "Showing TFI/node/TFO structures that appear more than %d times.\n", nLimit );
    for ( i = 0; i < nClasses-1; i++ )
    {
        if ( nLimit > -Vec_IntEntry(vCount, pPerm[i]) )
            break;
        printf( "%6d : ", i );
        printf( "%6d : ", pPerm[i] );
        printf( "Weight =%6d  ",   -Vec_IntEntry(vCount, pPerm[i]) );
        printf( "First obj =" );
        // print the object
        Gia_ManProfileCollect( p, Vec_IntEntry(vFirst, pPerm[i]), vCode, vCodeOffsets, vArray );
        Gia_ManProfilePrintOne( p, Vec_IntEntry(vFirst, pPerm[i]), vArray );
    }

    // cleanup
    ABC_FREE( pPerm );
    Vec_IntFree( vRes );
    Vec_IntFree( vCount );
    Vec_IntFree( vFirst );

    Vec_IntFree( vArray );
    Vec_IntFree( vCode );
    Vec_IntFree( vCodeOffsets );
    Gia_ManStaticFanoutStop( p );
}